

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

Reference flexbuffers::GetRoot(uint8_t *buffer,size_t size)

{
  uint8_t packed_type;
  uint8_t byte_width;
  uint8_t *end;
  size_t size_local;
  uint8_t *buffer_local;
  
  Reference::Reference
            ((Reference *)&buffer_local,buffer + ((size - 2) - (ulong)buffer[size - 1]),
             buffer[size - 1],buffer[size - 2]);
  return _buffer_local;
}

Assistant:

inline Reference GetRoot(const uint8_t *buffer, size_t size) {
  // See Finish() below for the serialization counterpart of this.
  // The root starts at the end of the buffer, so we parse backwards from there.
  auto end = buffer + size;
  auto byte_width = *--end;
  auto packed_type = *--end;
  end -= byte_width;  // The root data item.
  return Reference(end, byte_width, packed_type);
}